

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.c
# Opt level: O0

void wipe_game_window(tgestate_t *state)

{
  long lVar1;
  long in_RDI;
  uint8_t *p;
  uint8_t *in_stack_00000008;
  uint8_t iters;
  uint16_t *poffsets;
  uint8_t *screen;
  char local_19;
  uint16_t *local_18;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  local_18 = game_window_start_offsets;
  local_19 = ((char)*(undefined4 *)(in_RDI + 0xc) + -1) * '\b';
  do {
    memset((void *)(lVar1 + 0x30 + (long)(int)(uint)*local_18),0,(long)(*(int *)(in_RDI + 8) + -1));
    local_19 = local_19 + -1;
    local_18 = local_18 + 1;
  } while (local_19 != '\0');
  invalidate_bitmap((tgestate_t *)poffsets,in_stack_00000008,p._4_4_,(int)p);
  return;
}

Assistant:

static void wipe_game_window(tgestate_t *state)
{
  uint8_t *const  screen = &state->speccy->screen.pixels[0];
  const uint16_t *poffsets; /* was SP */
  uint8_t         iters;    /* was A */

  poffsets = &game_window_start_offsets[0]; /* points to offsets */
  iters = (state->rows - 1) * 8;
  do
  {
    uint8_t *const p = screen + *poffsets++;

    ASSERT_SCREEN_PTR_VALID(p);
    memset(p, 0, state->columns - 1); /* 23 columns (not 24 like the window buffer) */
  }
  while (--iters);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state,
                    screen + game_window_start_offsets[0],
                    state->columns * 8,
                    (state->rows - 1) * 8);
}